

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMPTEAnalyzerResults.cpp
# Opt level: O2

void __thiscall
SMPTEAnalyzerResults::fillSMPTE(SMPTEAnalyzerResults *this,Frame *frame,char *resultstr)

{
  Frame FVar1;
  char cVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  U32 i;
  uint uVar6;
  long lVar7;
  uint uVar8;
  char str2 [128];
  char str [128];
  char buff [128];
  
  str[0] = '\0';
  str[1] = '\0';
  str[2] = '\0';
  str[3] = '\0';
  str[4] = '\0';
  str[5] = '\0';
  str[6] = '\0';
  str[7] = '\0';
  str[8] = '\0';
  str[9] = '\0';
  str[10] = '\0';
  str[0xb] = '\0';
  str[0xc] = '\0';
  str[0xd] = '\0';
  str[0xe] = '\0';
  str[0xf] = '\0';
  str[0x10] = '\0';
  str[0x11] = '\0';
  str[0x12] = '\0';
  str[0x13] = '\0';
  str[0x14] = '\0';
  str[0x15] = '\0';
  str[0x16] = '\0';
  str[0x17] = '\0';
  str[0x18] = '\0';
  str[0x19] = '\0';
  str[0x1a] = '\0';
  str[0x1b] = '\0';
  str[0x1c] = '\0';
  str[0x1d] = '\0';
  str[0x1e] = '\0';
  str[0x1f] = '\0';
  str[0x20] = '\0';
  str[0x21] = '\0';
  str[0x22] = '\0';
  str[0x23] = '\0';
  str[0x24] = '\0';
  str[0x25] = '\0';
  str[0x26] = '\0';
  str[0x27] = '\0';
  str[0x28] = '\0';
  str[0x29] = '\0';
  str[0x2a] = '\0';
  str[0x2b] = '\0';
  str[0x2c] = '\0';
  str[0x2d] = '\0';
  str[0x2e] = '\0';
  str[0x2f] = '\0';
  str[0x30] = '\0';
  str[0x31] = '\0';
  str[0x32] = '\0';
  str[0x33] = '\0';
  str[0x34] = '\0';
  str[0x35] = '\0';
  str[0x36] = '\0';
  str[0x37] = '\0';
  str[0x38] = '\0';
  str[0x39] = '\0';
  str[0x3a] = '\0';
  str[0x3b] = '\0';
  str[0x3c] = '\0';
  str[0x3d] = '\0';
  str[0x3e] = '\0';
  str[0x3f] = '\0';
  str[0x40] = '\0';
  str[0x41] = '\0';
  str[0x42] = '\0';
  str[0x43] = '\0';
  str[0x44] = '\0';
  str[0x45] = '\0';
  str[0x46] = '\0';
  str[0x47] = '\0';
  str[0x48] = '\0';
  str[0x49] = '\0';
  str[0x4a] = '\0';
  str[0x4b] = '\0';
  str[0x4c] = '\0';
  str[0x4d] = '\0';
  str[0x4e] = '\0';
  str[0x4f] = '\0';
  str[0x50] = '\0';
  str[0x51] = '\0';
  str[0x52] = '\0';
  str[0x53] = '\0';
  str[0x54] = '\0';
  str[0x55] = '\0';
  str[0x56] = '\0';
  str[0x57] = '\0';
  str[0x58] = '\0';
  str[0x59] = '\0';
  str[0x5a] = '\0';
  str[0x5b] = '\0';
  str[0x5c] = '\0';
  str[0x5d] = '\0';
  str[0x5e] = '\0';
  str[0x5f] = '\0';
  str[0x60] = '\0';
  str[0x61] = '\0';
  str[0x62] = '\0';
  str[99] = '\0';
  str[100] = '\0';
  str[0x65] = '\0';
  str[0x66] = '\0';
  str[0x67] = '\0';
  str[0x68] = '\0';
  str[0x69] = '\0';
  str[0x6a] = '\0';
  str[0x6b] = '\0';
  str[0x6c] = '\0';
  str[0x6d] = '\0';
  str[0x6e] = '\0';
  str[0x6f] = '\0';
  str[0x70] = '\0';
  str[0x71] = '\0';
  str[0x72] = '\0';
  str[0x73] = '\0';
  str[0x74] = '\0';
  str[0x75] = '\0';
  str[0x76] = '\0';
  str[0x77] = '\0';
  str[0x78] = '\0';
  str[0x79] = '\0';
  str[0x7a] = '\0';
  str[0x7b] = '\0';
  str[0x7c] = '\0';
  str[0x7d] = '\0';
  str[0x7e] = '\0';
  str[0x7f] = '\0';
  uVar6 = 7;
  while (uVar8 = uVar6, -1 < (int)uVar8) {
    uVar3 = (ulong)uVar8;
    cVar2 = ((&DAT_001060e0)[uVar3 * 4] & (byte)frame[uVar3 + 0x10]) + 0x30;
    if (*(int *)(&DAT_001060c0 + uVar3 * 4) <
        (int)(uint)((&DAT_001060e0)[uVar3 * 4] & (byte)frame[uVar3 + 0x10])) {
      cVar2 = '?';
    }
    sVar4 = strlen(str);
    str[sVar4] = cVar2;
    uVar6 = uVar8 - 1;
    if ((((byte)uVar8 | ~(uVar8 != 0)) & 1) == 0) {
      cVar2 = ':';
      if (uVar8 == 2) {
        cVar2 = '.';
      }
      sVar4 = strlen(str);
      str[sVar4] = cVar2;
    }
  }
  if (resultstr == (char *)0x0) {
    AnalyzerResults::AddResultString
              ((char *)this,"T",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"TS",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,str + 8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,str + 6,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,str + 3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,str,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  strcpy(str2,str);
  FVar1 = frame[0x11];
  if (((byte)FVar1 & 4) == 0) {
    sVar4 = strlen(str2);
    builtin_strncpy(str2 + sVar4," no-drop",9);
  }
  else {
    sVar4 = strlen(str);
    (str + sVar4)[0] = 'd';
    (str + sVar4)[1] = '\0';
    sVar4 = strlen(str2);
    builtin_strncpy(str2 + sVar4," drop",6);
  }
  if (((byte)FVar1 & 8) == 0) {
    sVar4 = strlen(str2);
    builtin_strncpy(str2 + sVar4," no-colour",0xb);
  }
  else {
    sVar4 = strlen(str);
    (str + sVar4)[0] = 'c';
    (str + sVar4)[1] = '\0';
    sVar4 = strlen(str2);
    builtin_strncpy(str2 + sVar4," colour",8);
  }
  uVar3 = 1;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    uVar3 = (ulong)((uint)uVar3 ^ (uint)(byte)frame[lVar7 + 0x10]);
  }
  uVar6 = (uint)(uVar3 >> 4) ^ (uint)uVar3;
  uVar6 = uVar6 >> 2 ^ uVar6;
  sVar4 = strlen(str);
  pcVar5 = str + sVar4;
  if (((uVar6 >> 1 ^ uVar6) & 1) == 0) {
    pcVar5[0] = 'p';
    pcVar5[1] = '\0';
    sVar4 = strlen(str2);
    builtin_strncpy(str2 + sVar4," parity-ok",0xb);
  }
  else {
    str[sVar4 + 2] = '\0';
    pcVar5[0] = ' ';
    pcVar5[1] = 'P';
    sVar4 = strlen(str2);
    builtin_strncpy(str2 + sVar4," Parity-FAIL!",0xe);
  }
  snprintf(buff,0x80," User=%X-%X-%X-%X-%X-%X-%X-%X, groupBits=%d%d, reserved=%d");
  strncat(str2,buff,0x7f);
  if (resultstr == (char *)0x0) {
    AnalyzerResults::AddResultString
              ((char *)this,str,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,str2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    strcpy(resultstr,str2);
  }
  return;
}

Assistant:

void SMPTEAnalyzerResults::fillSMPTE(Frame frame, char * resultstr) 
{
	//                    frame     seconds   minutes   hours  
	const int max[8] = {   9,   4,   9,   5,   9,   5,   9,   2 };
	const int msk[8] = { 0xF, 0x3, 0xF, 0x7, 0xF, 0x7, 0xF, 0x3 };

	char str[128];
	char str2[128];
	int i;

	// We avoid direct bit operations on mData - as we're not
	// sure of the byte order of the varios platforms.
	//
	U8 *m = (U8*)&(frame.mData1);

	bzero(str, sizeof(str));
	for(i = 7; i >= 0; i--) {
		U8 c = m[i] & msk[i];
		if (c <= max[i])
			c += '0';
		else
			c = '?';
		str[ strlen(str) ] = c;

		if (i && (i %2) == 0) {
			str[ strlen(str) ] = (i == 2) ? '.' : ':';
		};
	};
	if (!resultstr) {
		AddResultString("T");
		AddResultString("TS");
		AddResultString( str + 8); // Just the .framecount
		AddResultString( str + 6); // Seconds, frames
		AddResultString( str + 3); // min/seconds/frames
		AddResultString( str );	   // whole HMS.frame
	};
	
	// From here we work on an abridge string and a fully
	// elaborated string in parallel.
	//	
	strcpy(str2,str);

	if (BIT(m,DROPBIT)) {
		strncat(str,"d", sizeof(str)-1);
		strncat(str2," drop", sizeof(str)-1);
	} else {
		strncat(str2," no-drop", sizeof(str)-1);
	};

	if (BIT(m,COLBIT)) {
		strncat(str,"c", sizeof(str)-1);
		strncat(str2," colour", sizeof(str)-1);
	} else {
		strncat(str2," no-colour", sizeof(str)-1);
	};
	
	// stick to machine byte order indepennt method.
	//
	// U64 p = frame.mData1; p ^= p >> 32; p ^= p >> 8; p ^= p >> 4; p ^= p >> 2; p ^= p >> 1; 
	//
	U32 p = 1; // for bte 8 & 9
	for(U32 i = 0; i < 8; i++) p ^= m[i];
	p ^= p >> 4; p ^= p >> 2; p ^= p >> 1; 

	// Should be an even number of bits; if we include
	// the parity bit in the list./
	//
	if ((p & 1) == 0) {
		strncat(str,"p", sizeof(str)-1);
		strncat(str2," parity-ok", sizeof(str2)-1);
	} else {
		strncat(str," P", sizeof(str)-1);
		strncat(str2," Parity-FAIL!", sizeof(str2)-1);
	};
	char buff[128];
	snprintf(buff,sizeof(buff)," User=%X-%X-%X-%X-%X-%X-%X-%X, groupBits=%d%d, reserved=%d",
			       //  0 ..  3  -- L frame
		(m[0]>>4)&0xF, //  4 ..  7     user 1
			       //  8 ..  9  -- H frame
			       //  10          drop frame
			       //  11          colour
		(m[1]>>4)&0xF, // 12 .. 15     user 2
			       // 16 .. 19     L sec
		(m[2]>>4)&0xF, // 20 .. 23     user 3
			       // 24 .. 26     H sec
                               //              parity bit
		(m[3]>>4)&0xF, // 28 .. 31     user 4
			       // 32 .. 35     L min
		(m[4]>>4)&0xF, // 36 .. 39     user 5
			       // 40 .. 42     H min
                               // 43           group bit 
		(m[5]>>4)&0xF, // 44 .. 47     user 6
			       // 47 .. 51     L hour
		(m[6]>>4)&0xF, // 52 .. 55     user 7
			       // 56 .. 57     H hour
                               // 58           reserved
                               // 59           group bit
		(m[7]>>4)&0xF, // 60 .. 63     user 8
			       // 64 .. 79     code words (16 bits)
		BIT(m,GR1BIT), // 43 - group bit
		BIT(m,GR2BIT), // 59 - group bit
		BIT(m,RESBIT)  // 58 - reserved
	);
	strncat(str2, buff, sizeof(str2)-1);

	if (!resultstr) {
		AddResultString( str );
		AddResultString( str2 );
	} else {
		strcpy(resultstr, str2);
	};
}